

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

size_t __thiscall
GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::GatherLMons
          (MI<6UL,_GF2::MOGrevlex<6UL>_> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *polyMons)

{
  bool bVar1;
  size_t sVar2;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_RSI;
  MM<6UL> *in_stack_00000008;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_00000010;
  const_iterator iter;
  list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  *in_stack_ffffffffffffffc8;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *this_00;
  _Self local_20;
  _Self local_18;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *local_10;
  
  local_10 = in_RSI;
  MP<6UL,_GF2::MOGrevlex<6UL>_>::SetEmpty((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c77f2);
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = local_10;
    std::_List_const_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator->
              ((_List_const_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> *)0x1c7839);
    MP<6UL,_GF2::MOGrevlex<6UL>_>::LM(this_00);
    MP<6UL,_GF2::MOGrevlex<6UL>_>::Union(in_stack_00000010,in_stack_00000008);
    std::_List_const_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator++(&local_18);
  }
  sVar2 = MP<6UL,_GF2::MOGrevlex<6UL>_>::Size((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c7864);
  return sVar2;
}

Assistant:

size_t GatherLMons(MP<_n, _O>& polyMons) const
	{	
		// согласованный?
		assert(IsConsistent(polyMons));
		polyMons.SetEmpty();
		for (const_iterator iter = begin(); iter != end(); ++iter)
			polyMons.Union(iter->LM());
		return polyMons.Size();
	}